

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DGXMLScanner::scanAttrListforNameSpaces
          (DGXMLScanner *this,RefVectorOf<xercesc_4_0::XMLAttr> *theAttrList,XMLSize_t attCount,
          XMLElementDecl *elemDecl)

{
  XMLCh XVar1;
  XMLCh XVar2;
  bool bVar3;
  uint uriId;
  XMLAttr **ppXVar4;
  RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher> *pRVar5;
  XMLAttr *pXVar6;
  XMLCh *pXVar7;
  XMLAttr *pXVar8;
  XMLCh *pXVar9;
  XMLCh *pXVar10;
  XMLSize_t XVar11;
  ValueVectorOf<xercesc_4_0::XMLAttr_*> *this_00;
  XMLSize_t getAt;
  
  this_00 = this->fAttrNSList;
  if (this_00->fCurCount != 0) {
    XVar11 = 0;
    do {
      ppXVar4 = ValueVectorOf<xercesc_4_0::XMLAttr_*>::elementAt(this_00,XVar11);
      pXVar6 = *ppXVar4;
      uriId = XMLScanner::resolvePrefix
                        (&this->super_XMLScanner,pXVar6->fAttName->fPrefix,Mode_Attribute);
      XMLAttr::setURIId(pXVar6,uriId);
      XVar11 = XVar11 + 1;
      this_00 = this->fAttrNSList;
    } while (XVar11 < this_00->fCurCount);
  }
  this_00->fCurCount = 0;
  if (100 < attCount) {
    pRVar5 = (this->super_XMLScanner).fAttrDupChkRegistry;
    if (pRVar5 == (RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher> *)0x0) {
      pRVar5 = (RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher> *)
               XMemory::operator_new(0x30,(this->super_XMLScanner).fMemoryManager);
      XVar11 = attCount * 2 + 1;
      pRVar5->fMemoryManager = (this->super_XMLScanner).fMemoryManager;
      pRVar5->fAdoptedElems = false;
      pRVar5->fBucketList = (RefHash2KeysTableBucketElem<xercesc_4_0::XMLAttr> **)0x0;
      pRVar5->fHashModulus = XVar11;
      pRVar5->fCount = 0;
      RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher>::initialize
                (pRVar5,XVar11);
      (this->super_XMLScanner).fAttrDupChkRegistry = pRVar5;
    }
    else {
      RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher>::removeAll(pRVar5);
    }
  }
  if (attCount != 0) {
    XVar11 = 0;
    do {
      pXVar6 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                         (&theAttrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,XVar11);
      if (attCount < 0x65) {
        if (XVar11 != 0) {
          getAt = 0;
          do {
            pXVar8 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                               (&theAttrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,getAt);
            if (pXVar8->fAttName->fURIId == pXVar6->fAttName->fURIId) {
              pXVar9 = pXVar8->fAttName->fLocalPart;
              pXVar7 = pXVar6->fAttName->fLocalPart;
              if (pXVar9 != pXVar7) {
                pXVar10 = pXVar7;
                if ((pXVar9 != (XMLCh *)0x0) && (pXVar7 != (XMLCh *)0x0)) {
                  do {
                    XVar1 = *pXVar9;
                    if (XVar1 == L'\0') goto LAB_002a0b6a;
                    pXVar9 = pXVar9 + 1;
                    XVar2 = *pXVar10;
                    pXVar10 = pXVar10 + 1;
                  } while (XVar1 == XVar2);
                  goto LAB_002a0b9c;
                }
                if (pXVar9 == (XMLCh *)0x0) {
                  if (pXVar7 == (XMLCh *)0x0) goto LAB_002a0b75;
LAB_002a0b6a:
                  bVar3 = *pXVar10 == L'\0';
                }
                else {
                  bVar3 = *pXVar9 == L'\0';
                  if ((pXVar7 != (XMLCh *)0x0) && (*pXVar9 == L'\0')) goto LAB_002a0b6a;
                }
                if (!bVar3) goto LAB_002a0b9c;
              }
LAB_002a0b75:
              pXVar9 = QName::getRawName(elemDecl->fElementName);
              XMLScanner::emitError
                        (&this->super_XMLScanner,AttrAlreadyUsedInSTag,pXVar7,pXVar9,(XMLCh *)0x0,
                         (XMLCh *)0x0);
            }
LAB_002a0b9c:
            getAt = getAt + 1;
          } while (getAt != XVar11);
        }
      }
      else {
        bVar3 = RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher>::containsKey
                          ((this->super_XMLScanner).fAttrDupChkRegistry,pXVar6->fAttName->fLocalPart
                           ,pXVar6->fAttName->fURIId);
        if (bVar3) {
          pXVar9 = pXVar6->fAttName->fLocalPart;
          pXVar7 = QName::getRawName(elemDecl->fElementName);
          XMLScanner::emitError
                    (&this->super_XMLScanner,AttrAlreadyUsedInSTag,pXVar9,pXVar7,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher>::put
                  ((this->super_XMLScanner).fAttrDupChkRegistry,pXVar6->fAttName->fLocalPart,
                   pXVar6->fAttName->fURIId,pXVar6);
      }
      XVar11 = XVar11 + 1;
    } while (XVar11 != attCount);
  }
  return;
}

Assistant:

void DGXMLScanner::scanAttrListforNameSpaces(RefVectorOf<XMLAttr>* theAttrList, XMLSize_t attCount,
                                                XMLElementDecl*       elemDecl)
{
    // Map prefixes to uris
    for (XMLSize_t i=0; i < fAttrNSList->size(); i++) {
        XMLAttr* providedAttr = fAttrNSList->elementAt(i);
        providedAttr->setURIId(
            resolvePrefix(providedAttr->getPrefix(), ElemStack::Mode_Attribute)
        );
    }

    fAttrNSList->removeAllElements();

     // Decide if to use hash table to do duplicate checking
    bool toUseHashTable = false;

	setAttrDupChkRegistry(attCount, toUseHashTable);
    for (XMLSize_t index = 0; index < attCount; index++)
    {
        // check for duplicate namespace attributes:
        // by checking for qualified names with the same local part and with prefixes
        // which have been bound to namespace names that are identical.
        XMLAttr* curAttr = theAttrList->elementAt(index);
        if (!toUseHashTable)
        {
            XMLAttr* loopAttr;
            for (XMLSize_t attrIndex=0; attrIndex < index; attrIndex++) {
                loopAttr = theAttrList->elementAt(attrIndex);
                if (loopAttr->getURIId() == curAttr->getURIId() &&
                    XMLString::equals(loopAttr->getName(), curAttr->getName())) {
                    emitError(
                        XMLErrs::AttrAlreadyUsedInSTag, curAttr->getName()
                        , elemDecl->getFullName()
                    );
                }
            }
        }
        else
        {
            if (fAttrDupChkRegistry->containsKey((void*)curAttr->getName(), curAttr->getURIId()))
            {
                emitError(
                    XMLErrs::AttrAlreadyUsedInSTag
                    , curAttr->getName(), elemDecl->getFullName()
                );
            }

            fAttrDupChkRegistry->put((void*)curAttr->getName(), curAttr->getURIId(), curAttr);
        }
    }
}